

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O1

fdb_status
filemgr_do_readahead
          (filemgr *file,bid_t bid,void *buf,void *buf_aligned,err_log_callback *log_callback)

{
  _List_node_base *p_Var1;
  ulong uVar2;
  plock_entry_t *ppVar3;
  _List_node_base *p_Var4;
  ssize_t sVar5;
  fdb_status fVar6;
  ulong uVar7;
  bid_t bVar8;
  long lVar9;
  bid_t is_writer;
  _List_node_base local_b8;
  bid_t local_a8;
  list<plock_node_*,_std::allocator<plock_node_*>_> plock_entries;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  FdbGcFunc auto_unlock;
  
  uVar2 = (file->latest_filesize).super___atomic_base<unsigned_long>._M_i / (ulong)file->blocksize;
  uVar7 = uVar2 - bid;
  if (uVar2 < bid) {
    uVar7 = 0;
  }
  if (global_config.num_blocks_readahead + bid <= uVar2) {
    uVar7 = (ulong)global_config.num_blocks_readahead;
  }
  plock_entries.super__List_base<plock_node_*,_std::allocator<plock_node_*>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&plock_entries;
  plock_entries.super__List_base<plock_node_*,_std::allocator<plock_node_*>_>._M_impl._M_node.
  _M_size = 0;
  plock_entries.super__List_base<plock_node_*,_std::allocator<plock_node_*>_>._M_impl._M_node.
  super__List_node_base._M_prev =
       plock_entries.super__List_base<plock_node_*,_std::allocator<plock_node_*>_>._M_impl._M_node.
       super__List_node_base._M_next;
  if (1 < uVar7) {
    lVar9 = uVar7 - 1;
    bVar8 = bid;
    do {
      bVar8 = bVar8 + 1;
      is_writer = 0;
      auto_unlock._0_8_ = bVar8;
      ppVar3 = plock_lock(&file->plock,&auto_unlock,&is_writer);
      p_Var4 = (_List_node_base *)operator_new(0x18);
      p_Var4[1]._M_next = (_List_node_base *)ppVar3;
      std::__detail::_List_node_base::_M_hook(p_Var4);
      plock_entries.super__List_base<plock_node_*,_std::allocator<plock_node_*>_>._M_impl._M_node.
      _M_size = plock_entries.super__List_base<plock_node_*,_std::allocator<plock_node_*>_>._M_impl.
                _M_node._M_size + 1;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
  }
  is_writer = (bid_t)file;
  std::__cxx11::list<plock_node_*,_std::allocator<plock_node_*>_>::list
            ((list<plock_node_*,_std::allocator<plock_node_*>_> *)&local_b8,&plock_entries);
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x20);
  *(bid_t *)local_78._M_unused._0_8_ = is_writer;
  p_Var4 = (_List_node_base *)((long)local_78._M_unused._0_8_ + 8);
  *(_List_node_base **)((long)local_78._M_unused._0_8_ + 8) = local_b8._M_next;
  *(_List_node_base **)((long)local_78._M_unused._0_8_ + 0x10) = local_b8._M_prev;
  *(bid_t *)((long)local_78._M_unused._0_8_ + 0x18) = local_a8;
  if (local_b8._M_next == &local_b8) {
    *(_List_node_base **)((long)local_78._M_unused._0_8_ + 0x10) = p_Var4;
    *(_List_node_base **)((long)local_78._M_unused._0_8_ + 8) = p_Var4;
  }
  else {
    (local_b8._M_prev)->_M_next = p_Var4;
    p_Var4->_M_next->_M_prev = p_Var4;
    local_a8 = 0;
    local_b8._M_next = &local_b8;
    local_b8._M_prev = &local_b8;
  }
  pcStack_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc:1997:28)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc:1997:28)>
             ::_M_manager;
  auto_unlock._0_8_ = auto_unlock._0_8_ & 0xffffffffffffff00;
  std::function<void_()>::function(&auto_unlock.func,(function<void_()> *)&local_78);
  p_Var4 = local_b8._M_next;
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
    p_Var4 = local_b8._M_next;
  }
  while (p_Var4 != &local_b8) {
    p_Var1 = (((_List_base<plock_node_*,_std::allocator<plock_node_*>_> *)&p_Var4->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    operator_delete(p_Var4);
    p_Var4 = p_Var1;
  }
  sVar5 = (*file->ops->pread)(file->fd,buf_aligned,(uVar7 & 0xffffffff) * (ulong)file->blocksize,
                              file->blocksize * bid);
  if (sVar5 == uVar7 * (long)global_config.blocksize) {
    memcpy(buf,buf_aligned,(long)global_config.blocksize);
    if (uVar7 != 0) {
      uVar2 = 0;
      do {
        bcache_write(file,bid + uVar2,
                     (void *)((long)global_config.blocksize * uVar2 + (long)buf_aligned),
                     BCACHE_REQ_CLEAN,false,true);
        uVar2 = uVar2 + 1;
      } while (uVar7 != uVar2);
    }
    fVar6 = FDB_RESULT_SUCCESS;
  }
  else {
    fVar6 = FDB_RESULT_READ_FAIL;
    fdb_log_impl(log_callback,2,FDB_RESULT_READ_FAIL,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                 ,"filemgr_do_readahead",0x7da,
                 "Read-ahead error: failed to read BID %lu in a database file \'%s\', num blocks %lu, pos %zu, filesize %zu\n"
                 ,bid,file->filename,uVar7,(file->pos).super___atomic_base<unsigned_long>._M_i,
                 (file->latest_filesize).super___atomic_base<unsigned_long>._M_i);
  }
  FdbGcFunc::~FdbGcFunc(&auto_unlock);
  p_Var4 = plock_entries.super__List_base<plock_node_*,_std::allocator<plock_node_*>_>._M_impl.
           _M_node.super__List_node_base._M_next;
  while (p_Var4 != (_List_node_base *)&plock_entries) {
    p_Var1 = (((_List_base<plock_node_*,_std::allocator<plock_node_*>_> *)&p_Var4->_M_next)->_M_impl
             )._M_node.super__List_node_base._M_next;
    operator_delete(p_Var4);
    p_Var4 = p_Var1;
  }
  return fVar6;
}

Assistant:

fdb_status filemgr_do_readahead(struct filemgr *file, bid_t bid, void *buf,
                        void* buf_aligned,
                        err_log_callback *log_callback)
{
    uint64_t total_blocks = atomic_get_uint64_t(&file->latest_filesize) / file->blocksize;
    size_t num_blocks_to_read = global_config.num_blocks_readahead;
    if (bid + num_blocks_to_read > total_blocks) {
        num_blocks_to_read = (total_blocks >= bid) ? total_blocks - bid : 0;
    }

    // Should lock all individual blocks except for the first block
    // (the first block is already locked by the caller).
    std::list<plock_entry_t*> plock_entries;
    for (size_t ii = 1; ii < num_blocks_to_read; ++ii) {
        bid_t locking_bid = bid + ii;
        bid_t is_writer = 0; // read operation.
        plock_entry_t* ee = plock_lock(&file->plock, &locking_bid, &is_writer);
        plock_entries.push_back(ee);
    }
    FdbGcFunc auto_unlock{ [file, plock_entries](){
        for (plock_entry_t* ee: plock_entries) {
            plock_unlock(&file->plock, ee);
        }
    } };

    ssize_t r = filemgr_read_blocks(file, buf_aligned, num_blocks_to_read, bid);
    if (r != (ssize_t)num_blocks_to_read * global_config.blocksize) {
        const char *msg = "Read-ahead error: failed to read BID %" _F64 " in a "
            "database file '%s', num blocks %" _F64 ", pos %zu, filesize %zu\n";
        fdb_log(log_callback, FDB_LOG_ERROR, FDB_RESULT_READ_FAIL,
                msg, bid, file->filename, num_blocks_to_read,
                atomic_get_uint64_t(&file->pos),
                atomic_get_uint64_t(&file->latest_filesize));
        return FDB_RESULT_READ_FAIL;
    }

    uint8_t* ptr = (uint8_t*)buf_aligned;

    // Copy the contents of the first block to user's buffer.
    memcpy(buf, ptr, global_config.blocksize);

    for (size_t ii = 0; ii < num_blocks_to_read; ++ii) {
        bid_t writing_bid = bid + ii;
        bcache_write(file, writing_bid, ptr + (ii * global_config.blocksize),
                     BCACHE_REQ_CLEAN, false, true);
    }

    return FDB_RESULT_SUCCESS;
}